

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O3

void ReadTicCmd(BYTE **stream,int player,int tic)

{
  ushort *data;
  usercmd_t *ucmd;
  ticcmd_t *ptVar1;
  ushort uVar2;
  ushort *puVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  long lVar11;
  usercmd_t *basis;
  long lVar12;
  
  lVar12 = (long)player;
  lVar11 = (long)(tic % 0x24);
  puVar3 = (ushort *)*stream;
  uVar2 = *puVar3;
  data = puVar3 + 1;
  *stream = (BYTE *)data;
  *(ushort *)(lVar12 * 0x2d0 + 0xa57490 + lVar11 * 0x14) = uVar2 << 8 | uVar2 >> 8;
  uVar2 = puVar3[1];
  *stream = (BYTE *)((long)puVar3 + 3);
  bVar4 = (byte)uVar2;
  puVar3 = data;
  while (bVar4 - 3 < 0xfffffffe) {
    Net_SkipCommand((uint)bVar4,stream);
    puVar3 = (ushort *)*stream;
    uVar2 = *puVar3;
    *stream = (BYTE *)((long)puVar3 + 1);
    bVar4 = (byte)uVar2;
  }
  ucmd = &netcmds[lVar12][lVar11].ucmd;
  FDynamicBuffer::SetData(NetSpecs[lVar12] + lVar11,(BYTE *)data,(int)puVar3 - (int)data);
  if (bVar4 == 1) {
    if (tic == 0) {
      basis = (usercmd_t *)0x0;
    }
    else {
      basis = &netcmds[lVar12][(tic + -1) % 0x24].ucmd;
    }
    UnpackUserCmd(ucmd,basis,stream);
  }
  else {
    if (tic == 0) {
      ucmd->buttons = 0;
      ucmd->pitch = 0;
      ucmd->yaw = 0;
      ucmd->roll = 0;
      ucmd->forwardmove = 0;
      ucmd->sidemove = 0;
      ucmd->upmove = 0;
      return;
    }
    ptVar1 = netcmds[lVar12] + (tic + -1) % 0x24;
    sVar5 = (ptVar1->ucmd).pitch;
    sVar6 = (ptVar1->ucmd).yaw;
    sVar7 = (ptVar1->ucmd).roll;
    sVar8 = (ptVar1->ucmd).forwardmove;
    sVar9 = (ptVar1->ucmd).sidemove;
    sVar10 = (ptVar1->ucmd).upmove;
    ucmd->buttons = (ptVar1->ucmd).buttons;
    ucmd->pitch = sVar5;
    ucmd->yaw = sVar6;
    ucmd->roll = sVar7;
    ucmd->forwardmove = sVar8;
    ucmd->sidemove = sVar9;
    ucmd->upmove = sVar10;
  }
  if (((0x24 < tic) && (consoleplayer == player)) &&
     (consistancy[lVar12][lVar11] != (short)ucmd[1].buttons)) {
    __assert_fail("consistancy[player][ticmod] == tcmd->consistancy",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_protocol.cpp"
                  ,0x1bb,"void ReadTicCmd(BYTE **, int, int)");
  }
  return;
}

Assistant:

void ReadTicCmd (BYTE **stream, int player, int tic)
{
	int type;
	BYTE *start;
	ticcmd_t *tcmd;

	int ticmod = tic % BACKUPTICS;

	tcmd = &netcmds[player][ticmod];
	tcmd->consistancy = ReadWord (stream);

	start = *stream;

	while ((type = ReadByte (stream)) != DEM_USERCMD && type != DEM_EMPTYUSERCMD)
		Net_SkipCommand (type, stream);

	NetSpecs[player][ticmod].SetData (start, int(*stream - start - 1));

	if (type == DEM_USERCMD)
	{
		UnpackUserCmd (&tcmd->ucmd,
			tic ? &netcmds[player][(tic-1)%BACKUPTICS].ucmd : NULL, stream);
	}
	else
	{
		if (tic)
		{
			memcpy (&tcmd->ucmd, &netcmds[player][(tic-1)%BACKUPTICS].ucmd, sizeof(tcmd->ucmd));
		}
		else
		{
			memset (&tcmd->ucmd, 0, sizeof(tcmd->ucmd));
		}
	}

	if (player==consoleplayer&&tic>BACKUPTICS)
		assert(consistancy[player][ticmod] == tcmd->consistancy);
}